

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_xmi_midiout.cpp
# Opt level: O2

DWORD * __thiscall
XMISong::MakeEvents(XMISong *this,DWORD *events,DWORD *max_event_p,DWORD max_time)

{
  DWORD time;
  EventSource due;
  AutoNoteOff *pAVar1;
  DWORD delay;
  DWORD *events_00;
  bool sysex_noroom;
  bool local_41;
  uint local_40;
  uint local_3c;
  DWORD *local_38;
  
  due = this->EventDue;
  local_40 = 0;
  local_3c = max_time;
  local_38 = events;
LAB_0035a859:
  do {
    if (((max_event_p <= events) || (due == EVENT_None)) || (local_3c < local_40)) {
      return events;
    }
    delay = 0;
    do {
      if (due == EVENT_Real) {
        pAVar1 = (AutoNoteOff *)&this->CurrSong->Delay;
      }
      else {
        pAVar1 = (this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>.Array;
      }
      time = pAVar1->Delay;
      delay = delay + time;
      local_40 = local_40 +
                 ((this->super_MIDIStreamer).Tempo * time) /
                 (uint)(this->super_MIDIStreamer).Division;
      AdvanceSong(this,time);
      due = this->EventDue;
      events_00 = events;
      do {
        local_41 = false;
        events = SendCommand(this,events_00,due,delay,(long)max_event_p - (long)events_00 >> 2,
                             &local_41);
        if (local_41 == true) {
          return events_00;
        }
        due = FindNextDue(this);
        this->EventDue = due;
        if (events != events_00) {
          delay = 0;
        }
        if (due == EVENT_Real) {
          pAVar1 = (AutoNoteOff *)&this->CurrSong->Delay;
        }
        else {
          if (due == EVENT_None) goto LAB_0035a859;
          pAVar1 = (this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>.Array;
        }
      } while ((events < max_event_p) && (events_00 = events, pAVar1->Delay == 0));
    } while (events == local_38);
  } while( true );
}

Assistant:

DWORD *XMISong::MakeEvents(DWORD *events, DWORD *max_event_p, DWORD max_time)
{
	DWORD *start_events;
	DWORD tot_time = 0;
	DWORD time = 0;
	DWORD delay;

	start_events = events;
	while (EventDue != EVENT_None && events < max_event_p && tot_time <= max_time)
	{
		// It's possible that this tick may be nothing but meta-events and
		// not generate any real events. Repeat this until we actually
		// get some output so we don't send an empty buffer to the MIDI
		// device.
		do
		{
			delay = GET_DELAY;
			time += delay;
			// Advance time for all tracks by the amount needed for the one up next.
			tot_time += delay * Tempo / Division;
			AdvanceSong(delay);
			// Play all events for this tick.
			do
			{
				bool sysex_noroom = false;
				DWORD *new_events = SendCommand(events, EventDue, time, max_event_p - events, sysex_noroom);
				if (sysex_noroom)
				{
					return events;
				}
				EventDue = FindNextDue();
				if (new_events != events)
				{
					time = 0;
				}
				events = new_events;
			}
			while (EventDue != EVENT_None && GET_DELAY == 0 && events < max_event_p);
		}
		while (start_events == events && EventDue != EVENT_None);
		time = 0;
	}
	return events;
}